

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.h
# Opt level: O2

void __thiscall fmp4_stream::tfdt::tfdt(tfdt *this)

{
  allocator local_31;
  string local_30 [32];
  
  full_box::full_box(&this->super_full_box);
  (this->super_full_box).super_box._vptr_box = (_func_int **)&PTR_size_00117cd8;
  this->base_media_decode_time_ = 0;
  std::__cxx11::string::string(local_30,"tfdt",&local_31);
  std::__cxx11::string::operator=((string *)&(this->super_full_box).super_box.box_type_,local_30);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

tfdt() : full_box() , base_media_decode_time_(0){ box_type_ = std::string("tfdt"); }